

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_right_sequence.h
# Opt level: O2

void * __thiscall
bk_lib::detail::left_right_rep<Clasp::Literal,_unsigned_int>::realloc
          (left_right_rep<Clasp::Literal,_unsigned_int> *this,void *__ptr,size_t __size)

{
  buf_type *__src;
  uint uVar1;
  buf_type *__dest;
  void *extraout_RAX;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  size_type sVar6;
  
  uVar1 = *(uint *)&this->field_0x8 >> 2 & 0x1fffffff;
  uVar5 = 0x10;
  if (2 < uVar1) {
    uVar5 = (ulong)(uVar1 * 6 & 0xfffffffc);
  }
  __dest = (buf_type *)operator_new(uVar5);
  uVar2 = *(uint *)&this->field_0x8 & 0x7fffffff;
  uVar1 = this->right_;
  uVar3 = uVar2 - uVar1;
  uVar4 = (uint)uVar5;
  if (uVar2 == uVar1 && this->left_ == 0) {
    sVar6 = uVar4 - uVar3;
  }
  else {
    __src = this->buf_;
    memcpy(__dest,__src,(ulong)(this->left_ & 0xfffffffc));
    sVar6 = uVar4 - uVar3;
    memcpy(__dest + sVar6,__src + uVar1,(ulong)(uVar3 & 0xfffffffc));
  }
  release(this);
  this->buf_ = __dest;
  *(uint *)&this->field_0x8 = uVar4 | 0x80000000;
  this->right_ = sVar6;
  return extraout_RAX;
}

Assistant:

void left_right_rep<L, R>::realloc() {
	size_type new_cap = ((capacity()*3)>>1) * block_size;
	size_type min_cap = 4 * block_size;
	if (new_cap < min_cap) new_cap = min_cap;
	buf_type* temp = (buf_type*)::operator new(new_cap*sizeof(buf_type));
	size_type r = cap_ - right_;
	if (!empty()) {
		// copy left
		std::memcpy(temp, begin(), left_size()*sizeof(L));
		// copy right
		std::memcpy(temp+(new_cap-r), right(), right_size() * sizeof(R));
	}
	// swap
	release();
	buf_   = temp;
	cap_   = new_cap;
	free_  = 1;
	right_ = new_cap - r;
}